

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  ValueLength VVar4;
  ulong uVar5;
  ulong uVar6;
  ulong extraout_RAX;
  Exception *this_00;
  byte *pbVar7;
  ulong uVar8;
  
  if ((ulong)"\x01\x01"[*start] != 0) {
    return (ulong)"\x01\x01"[*start];
  }
  bVar3 = *start;
  uVar5 = (ulong)bVar3;
  switch(SliceStaticData::TypeMap[uVar5]) {
  case Array:
  case Object:
    if ((byte)(bVar3 - 0x13) < 2) {
      pbVar7 = start + 1;
      VVar4 = 0;
      bVar3 = 0;
      do {
        bVar1 = *pbVar7;
        VVar4 = VVar4 + ((ulong)(bVar1 & 0x7f) << (bVar3 & 0x3f));
        bVar3 = bVar3 + 7;
        pbVar7 = pbVar7 + 1;
      } while ((char)bVar1 < '\0');
      return VVar4;
    }
    if (0x1f < bVar3) {
      SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::byteSizeDynamic();
      uVar5 = extraout_RAX;
      goto LAB_0010e73e;
    }
    switch(SliceStaticData::WidthMap[uVar5]) {
    case 1:
      return (ulong)start[1];
    case 2:
      return (ulong)*(ushort *)(start + 1);
    case 3:
      uVar6 = (ulong)((uint)start[2] << 8 | (uint)start[3] << 0x10);
      uVar5 = (ulong)start[1];
      goto LAB_0010e730;
    case 4:
      return (ulong)*(uint *)(start + 1);
    case 5:
      uVar2 = *(uint *)(start + 1);
      uVar5 = (ulong)start[5];
      break;
    case 6:
      uVar2 = *(uint *)(start + 1);
      uVar5 = (ulong)*(ushort *)(start + 5);
      break;
    case 7:
      uVar6 = (ulong)*(uint3 *)(start + 5) << 0x20;
      uVar5 = (ulong)*(uint *)(start + 1);
      goto LAB_0010e730;
    case 8:
      return *(ValueLength *)(start + 1);
    default:
      return 0;
    }
    uVar6 = (ulong)uVar2;
    uVar5 = uVar5 << 0x20;
LAB_0010e730:
    return uVar5 | uVar6;
  case String:
    if (0xbe < bVar3) {
switchD_0010e568_caseD_fd:
      return *(long *)(start + 1) + 9;
    }
LAB_0010e73e:
    return uVar5 - 0x40;
  case Binary:
    uVar5 = uVar5 - 0xbe;
    switch(bVar3) {
    case 0xc0:
      goto switchD_0010e61e_caseD_c8;
    case 0xc1:
      goto switchD_0010e61e_caseD_c9;
    case 0xc2:
      goto switchD_0010e61e_caseD_ca;
    case 0xc3:
      goto switchD_0010e61e_caseD_cb;
    case 0xc4:
      goto switchD_0010e61e_caseD_cc;
    case 0xc5:
      goto switchD_0010e61e_caseD_cd;
    case 0xc6:
      goto switchD_0010e61e_caseD_ce;
    case 199:
      goto switchD_0010e61e_caseD_cf;
    default:
      goto switchD_0010e61e_default;
    }
  case BCD:
    if (0xcf < bVar3) {
      uVar5 = (ulong)(bVar3 - 0xce);
      switch(bVar3) {
      case 0xd0:
        goto switchD_0010e61e_caseD_c8;
      case 0xd1:
        goto switchD_0010e61e_caseD_c9;
      case 0xd2:
        goto switchD_0010e61e_caseD_ca;
      case 0xd3:
        goto switchD_0010e61e_caseD_cb;
      case 0xd4:
        goto switchD_0010e61e_caseD_cc;
      case 0xd5:
        goto switchD_0010e61e_caseD_cd;
      case 0xd6:
        goto switchD_0010e61e_caseD_ce;
      case 0xd7:
        goto switchD_0010e61e_caseD_cf;
      default:
        goto switchD_0010e61e_default;
      }
    }
    uVar5 = uVar5 - 0xc6;
    switch(bVar3) {
    case 200:
      goto switchD_0010e61e_caseD_c8;
    case 0xc9:
switchD_0010e61e_caseD_c9:
      uVar6 = (ulong)*(ushort *)(start + 1);
      goto LAB_0010e6d6;
    case 0xca:
switchD_0010e61e_caseD_ca:
      uVar8 = (ulong)((uint)start[2] << 8 | (uint)start[3] << 0x10);
      uVar6 = (ulong)start[1];
      break;
    case 0xcb:
switchD_0010e61e_caseD_cb:
      uVar6 = (ulong)*(uint *)(start + 1);
      goto LAB_0010e6d6;
    case 0xcc:
switchD_0010e61e_caseD_cc:
      uVar2 = *(uint *)(start + 1);
      uVar6 = (ulong)start[5];
      goto LAB_0010e6b9;
    case 0xcd:
switchD_0010e61e_caseD_cd:
      uVar2 = *(uint *)(start + 1);
      uVar6 = (ulong)*(ushort *)(start + 5);
LAB_0010e6b9:
      uVar8 = (ulong)uVar2;
      uVar6 = uVar6 << 0x20;
      break;
    case 0xce:
switchD_0010e61e_caseD_ce:
      uVar8 = (ulong)*(uint3 *)(start + 5) << 0x20;
      uVar6 = (ulong)*(uint *)(start + 1);
      break;
    case 0xcf:
switchD_0010e61e_caseD_cf:
      uVar6 = *(ulong *)(start + 1);
      goto LAB_0010e6d6;
    default:
switchD_0010e61e_default:
      uVar6 = 0;
      goto LAB_0010e6d6;
    }
    uVar6 = uVar6 | uVar8;
LAB_0010e6d6:
    return uVar6 + uVar5;
  case Custom:
    switch(bVar3) {
    case 0xf4:
    case 0xf5:
    case 0xf6:
      return (ulong)start[1] + 2;
    case 0xf7:
    case 0xf8:
    case 0xf9:
      return (ulong)*(ushort *)(start + 1) + 3;
    case 0xfa:
    case 0xfb:
    case 0xfc:
      return (ulong)*(uint *)(start + 1) + 5;
    case 0xfd:
    case 0xfe:
    case 0xff:
      goto switchD_0010e568_caseD_fd;
    }
    break;
  case Tagged:
    bVar3 = 0;
    pbVar7 = start;
    do {
      bVar1 = *pbVar7;
      if ((bVar1 & 0xfe) != 0xee) break;
      uVar2 = (uint)(bVar1 == 0xef) * 9;
      if (bVar1 == 0xee) {
        uVar2 = 2;
      }
      bVar3 = bVar3 + (char)uVar2;
      pbVar7 = pbVar7 + uVar2;
    } while (uVar2 != 0);
    if (bVar3 != 0) {
      uVar6 = (ulong)bVar3;
      uVar5 = (ulong)"\x01\x01"[start[uVar6]];
      if (uVar5 == 0) {
        uVar5 = byteSizeDynamic(this,start + uVar6);
      }
      return uVar5 + uVar6;
    }
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::byteSizeDynamic();
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InternalError,"Invalid type for byteSize()");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
switchD_0010e61e_caseD_c8:
  uVar6 = (ulong)start[1];
  goto LAB_0010e6d6;
}

Assistant:

ValueLength byteSize(uint8_t const* start) const {
    // check if the type has a fixed length first
    ValueLength l =
        static_cast<ValueLength>(SliceStaticData::FixedTypeLengths[*start]);
    if (l != 0) {
      // return fixed length
      return l;
    }
    return byteSizeDynamic(start);
  }